

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_chacha20poly1305(void)

{
  ptls_cipher_suite_t **pppVar1;
  ptls_cipher_suite_t **pppVar2;
  ptls_cipher_suite_t *ppVar3;
  ptls_cipher_suite_t *ppVar4;
  
  pppVar2 = ctx->cipher_suites;
  ppVar3 = *pppVar2;
  ppVar4 = ppVar3;
  pppVar1 = pppVar2;
  if (ppVar3 != (ptls_cipher_suite_t *)0x0) {
    do {
      if (ppVar4->id == 0x1303) goto LAB_00119a5d;
      ppVar4 = pppVar1[1];
      pppVar1 = pppVar1 + 1;
    } while (ppVar4 != (ptls_cipher_suite_t *)0x0);
    ppVar4 = (ptls_cipher_suite_t *)0x0;
LAB_00119a5d:
    do {
      pppVar2 = pppVar2 + 1;
      if (ppVar3->id == 0x1303) {
        if (ppVar4 == (ptls_cipher_suite_t *)0x0) {
          return;
        }
        test_ciphersuite((ptls_cipher_suite_t *)ppVar4->aead,(ptls_cipher_suite_t *)ppVar4->hash);
        test_aad_ciphersuite
                  ((ptls_cipher_suite_t *)ppVar4->aead,(ptls_cipher_suite_t *)ppVar4->hash);
        return;
      }
      ppVar3 = *pppVar2;
    } while (ppVar3 != (ptls_cipher_suite_t *)0x0);
  }
  return;
}

Assistant:

static void test_chacha20poly1305(void)
{
    ptls_cipher_suite_t *cs = find_cipher(ctx, PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256),
                        *cs_peer = find_cipher(ctx, PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256);

    if (cs != NULL && cs_peer != NULL) {
        test_ciphersuite(cs, cs_peer);
        test_aad_ciphersuite(cs, cs_peer);
    }
}